

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.cpp
# Opt level: O1

void __thiscall
Ptex::v2_2::PtexReaderCache::logRecentlyUsed(PtexReaderCache *this,PtexCachedReader *reader)

{
  int iVar1;
  int iVar2;
  MruList *pMVar3;
  
  do {
    pMVar3 = this->_mruList;
    LOCK();
    iVar2 = pMVar3->next;
    pMVar3->next = pMVar3->next + 1;
    UNLOCK();
    iVar1 = iVar2 + 1;
    if (iVar1 < 0x33) {
      pMVar3->files[iVar2] = reader;
    }
    else {
      do {
        processMru(this);
      } while (0x31 < this->_mruList->next);
    }
  } while (0x32 < iVar1);
  return;
}

Assistant:

void PtexReaderCache::logRecentlyUsed(PtexCachedReader* reader)
{
    while (1) {
        MruList* mruList = _mruList;
        int slot = AtomicIncrement(&mruList->next)-1;
        if (slot < numMruFiles) {
            mruList->files[slot] = reader;
            return;
        }
        // no mru slot available, process mru list and try again
        do processMru();
        while (_mruList->next >= numMruFiles);
    }
}